

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestCase *pTVar3;
  pointer ppTVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  string kTestsuites;
  int local_8c;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testsuites","");
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
  local_8c = 0;
  ppTVar4 = (test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    lVar7 = 0;
    local_8c = 0;
    do {
      pTVar3 = ppTVar4[lVar7];
      local_8c = local_8c +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(pTVar3->test_info_list_).
                                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                              ._M_impl + 8) -
                              *(long *)&(pTVar3->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data) >> 3);
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"tests","");
  StreamableToString<int>(&local_68,&local_8c);
  OutputXmlAttribute(stream,&local_48,&local_88,&local_68);
  paVar2 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"name","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"AllTests","");
  OutputXmlAttribute(stream,&local_48,&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  ppTVar4 = (test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((test_cases->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppTVar4) {
    uVar8 = 0;
    do {
      PrintXmlTestCase(stream,ppTVar4[uVar8]);
      uVar8 = uVar8 + 1;
      ppTVar4 = (test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(test_cases->
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    PrintXmlTestCase(stream, *test_cases[i]);
  }
  *stream << "</" << kTestsuites << ">\n";
}